

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_gettimeofday(uv_timeval_t *tv)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  timeval time;
  
  if (tv == (uv_timeval_t *)0x0) {
    iVar3 = -0x16;
  }
  else {
    iVar3 = 0;
    iVar1 = gettimeofday((timeval *)&time,(__timezone_ptr_t)0x0);
    if (iVar1 == 0) {
      tv->tv_sec = time.tv_sec;
      tv->tv_usec = (int32_t)time.tv_usec;
    }
    else {
      piVar2 = __errno_location();
      iVar3 = -*piVar2;
    }
  }
  return iVar3;
}

Assistant:

int uv_gettimeofday(uv_timeval_t* tv) {
  struct timeval time;

  if (tv == NULL)
    return UV_EINVAL;

  if (gettimeofday(&time, NULL) != 0)
    return UV__ERR(errno);

  tv->tv_sec = (int64_t) time.tv_sec;
  tv->tv_usec = (int32_t) time.tv_usec;
  return 0;
}